

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateHeapArguments_TTD
          (JavascriptLibrary *this,uint32 numOfArguments,uint32 formalCount,
          ActivationObject *frameObject,byte *deletedArray)

{
  HeapArgumentsObject *this_00;
  ulong uVar1;
  
  this_00 = CreateHeapArguments(this,frameObject,formalCount,false);
  HeapArgumentsObject::SetNumberOfArguments(this_00,numOfArguments);
  if (formalCount != 0) {
    uVar1 = 0;
    do {
      if (deletedArray[uVar1] != '\0') {
        (*(this_00->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                  (this_00,uVar1 & 0xffffffff);
      }
      uVar1 = uVar1 + 1;
    } while (formalCount != uVar1);
  }
  return (RecyclableObject *)this_00;
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateHeapArguments_TTD(uint32 numOfArguments, uint32 formalCount, ActivationObject* frameObject, byte* deletedArray)
    {
        Js::HeapArgumentsObject* argsObj = this->CreateHeapArguments(frameObject, formalCount);

        argsObj->SetNumberOfArguments(numOfArguments);
        for(uint32 i = 0; i < formalCount; ++i)
        {
            if(deletedArray[i])
            {
                argsObj->DeleteItemAt(i);
            }
        }

        return argsObj;
    }